

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O0

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,Vec2f *uvs,TGAImage *texture)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  long lVar5;
  TGAImage *this_00;
  vec<3,_float,_(glm::qualifier)0> P;
  vec<3,_float,_(glm::qualifier)0> A;
  anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 aVar6;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar8;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar9;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar10;
  int iVar11;
  int iVar12;
  TGAColor TVar13;
  float *pfVar14;
  int *piVar15;
  float *pfVar16;
  float *__b;
  float fVar17;
  Vec3f VVar18;
  TGAColor local_149;
  vec<2,_float,_(glm::qualifier)0> vStack_144;
  TGAColor c;
  vec<2,_float,_(glm::qualifier)0> local_13c;
  vec<2,_float,_(glm::qualifier)0> local_134;
  vec<2,_float,_(glm::qualifier)0> local_12c;
  vec<2,_float,_(glm::qualifier)0> local_124;
  Vec2f uvf;
  float pz;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_110;
  undefined1 local_8c [8];
  Vec3f bc_screen;
  Vec3f p;
  int local_6c;
  int j;
  int i_1;
  Vec2f clamp;
  Vec2f bboxmax;
  Vec2f bboxmin;
  size_t i;
  Vec2i ptis [3];
  int width;
  TGAImage *texture_local;
  Vec2f *uvs_local;
  Vec3f *pts_local;
  TinyRender *this_local;
  
  ptis[2].field_1.y = TGAImage::get_width(*(TGAImage **)(this + 8));
  bboxmin.field_0 = (anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3)0x0;
  bboxmin.field_1 = (anon_union_4_3_4e90b0ec_for_vec<2,_float,_(glm::qualifier)0>_5)0x0;
  for (; (ulong)bboxmin < 3; bboxmin = (Vec2f)((long)bboxmin + 1)) {
    pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + (long)bboxmin,0);
    fVar17 = *pfVar14;
    piVar15 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](ptis + (long)bboxmin + -1,0);
    *piVar15 = (int)(fVar17 + 0.5);
    pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + (long)bboxmin,1);
    fVar17 = *pfVar14;
    piVar15 = glm::vec<2,_int,_(glm::qualifier)0>::operator[](ptis + (long)bboxmin + -1,1);
    *piVar15 = (int)(fVar17 + 0.5);
  }
  iVar11 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar12 = TGAImage::get_height(*(TGAImage **)(this + 8));
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
            ((vec<2,float,(glm::qualifier)0> *)&bboxmax,iVar11 + -1,iVar12 + -1);
  memset(&clamp,0,8);
  iVar11 = TGAImage::get_width(*(TGAImage **)(this + 8));
  iVar12 = TGAImage::get_height(*(TGAImage **)(this + 8));
  glm::vec<2,float,(glm::qualifier)0>::vec<int,int>
            ((vec<2,float,(glm::qualifier)0> *)&j,iVar11 + -1,iVar12 + -1);
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    for (p.field_2.z = 0.0; (int)p.field_2 < 2; p.field_2.z = p.field_2.z + 1) {
      p.field_1.y = 0.0;
      pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&bboxmax,(length_type)p.field_2);
      pfVar16 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          (pts + local_6c,(length_type)p.field_2);
      pfVar14 = std::min<float>(pfVar14,pfVar16);
      pfVar14 = std::max<float>(&p.field_1.y,pfVar14);
      fVar17 = *pfVar14;
      pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&bboxmax,(length_type)p.field_2);
      *pfVar14 = fVar17;
      pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[]
                          ((vec<2,_float,_(glm::qualifier)0> *)&j,(length_type)p.field_2);
      pfVar16 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&clamp,(length_type)p.field_2);
      __b = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + local_6c,(length_type)p.field_2)
      ;
      pfVar16 = std::max<float>(pfVar16,__b);
      pfVar14 = std::min<float>(pfVar14,pfVar16);
      fVar17 = *pfVar14;
      pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&clamp,(length_type)p.field_2);
      *pfVar14 = fVar17;
    }
  }
  pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                      ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
  *pfVar14 = (float)(int)(bboxmax.field_0.x + 0.5);
  while (pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                             ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0),
        *pfVar14 <= clamp.field_0.x) {
    fVar17 = bboxmax.field_1.y + 0.5;
    pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
    *pfVar14 = (float)(int)fVar17;
    while (pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1),
          *pfVar14 <= clamp.field_1.y) {
      A.field_0 = pts->field_0;
      A.field_1 = pts->field_1;
      A.field_2 = pts->field_2;
      P.field_1.y = bc_screen.field_2.z;
      P.field_0.x = bc_screen.field_1.y;
      P.field_2.z = p.field_0.x;
      VVar18 = barycentric<3ul>(A,pts[1],pts[2],P);
      stack0xfffffffffffffee8 = VVar18._0_8_;
      local_8c._0_4_ = uvf.field_1;
      local_8c._4_4_ = pz;
      local_110 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)VVar18.field_2;
      bc_screen.field_0 = local_110;
      unique0x10000782 = VVar18;
      pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
      if (((0.0 < *pfVar14 || *pfVar14 == 0.0) &&
          (pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                               ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1),
          0.0 < *pfVar14 || *pfVar14 == 0.0)) &&
         (pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2),
         0.0 < *pfVar14 || *pfVar14 == 0.0)) {
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts,2);
        fVar17 = *pfVar14;
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
        fVar1 = *pfVar14;
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + 1,2);
        fVar2 = *pfVar14;
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
        fVar3 = *pfVar14;
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[](pts + 2,2);
        fVar4 = *pfVar14;
        pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                            ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
        aVar9 = bc_screen.field_2;
        aVar7 = bc_screen.field_1;
        uvf.field_0.x = fVar4 * *pfVar14 + fVar17 * fVar1 + fVar2 * fVar3;
        lVar5 = *(long *)(this + 0x10);
        iVar11 = TGAImage::get_width(*(TGAImage **)(this + 8));
        aVar10 = bc_screen.field_2;
        aVar8 = bc_screen.field_1;
        aVar6 = uvf.field_0;
        if (uvf.field_0.x <= *(float *)(lVar5 + (long)(int)(aVar9.z * (float)iVar11 + aVar7.y) * 4))
        {
          lVar5 = *(long *)(this + 0x10);
          iVar11 = TGAImage::get_width(*(TGAImage **)(this + 8));
          *(anon_union_4_3_4e90da17_for_vec<2,_float,_(glm::qualifier)0>_3 *)
           (lVar5 + (long)(int)(aVar10.z * (float)iVar11 + aVar8.y) * 4) = aVar6;
          pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,0);
          local_134 = glm::operator*(uvs,*pfVar14);
          pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,1);
          local_13c = glm::operator*(uvs + 1,*pfVar14);
          local_12c = glm::operator+(&local_134,&local_13c);
          pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)local_8c,2);
          vStack_144 = glm::operator*(uvs + 2,*pfVar14);
          local_124 = glm::operator+(&local_12c,&stack0xfffffffffffffebc);
          iVar11 = TGAImage::get_width(texture);
          pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&local_124,0);
          fVar17 = *pfVar14;
          iVar12 = TGAImage::get_height(texture);
          pfVar14 = glm::vec<2,_float,_(glm::qualifier)0>::operator[](&local_124,1);
          TVar13 = TGAImage::get(texture,(int)((float)(iVar11 + -1) * fVar17 + 0.5),
                                 (int)((float)(iVar12 + -1) * *pfVar14 + 0.5));
          local_149.bgra = TVar13.bgra;
          local_149.bytespp = TVar13.bytespp;
          this_00 = *(TGAImage **)(this + 8);
          pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
          fVar17 = *pfVar14;
          pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                              ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
          TGAImage::set(this_00,(int)fVar17,(int)*pfVar14,&local_149);
        }
      }
      pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                          ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,1);
      *pfVar14 = *pfVar14 + 1.0;
    }
    pfVar14 = glm::vec<3,_float,_(glm::qualifier)0>::operator[]
                        ((vec<3,_float,_(glm::qualifier)0> *)&bc_screen.field_1,0);
    *pfVar14 = *pfVar14 + 1.0;
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, Vec2f* uvs, TGAImage* texture) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = int(bboxmin.x + .5f); p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = int(bboxmin.y + .5f); p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;
      /**
       * Calculate texture color
       **/
      Vec2f uvf =
          uvs[0] * bc_screen[0] + uvs[1] * bc_screen[1] + uvs[2] * bc_screen[2];
      TGAColor c =
          texture->get(int((texture->get_width() - 1) * uvf[0] + .5f),
                       int((texture->get_height() - 1) * uvf[1] + .5f));
      mImage->set(p[0], p[1], c);
    }
  }
}